

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float ab_len_sqr;
  float dot;
  ImVec2 ab_dir;
  ImVec2 ap;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  auVar4._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x1acf22);
  auVar4._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x1acf37);
  auVar5._8_56_ = extraout_var_00;
  uVar2 = vmovlpd_avx(auVar5._0_16_);
  local_28 = (float)uVar1;
  local_30 = (float)uVar2;
  uStack_24 = (float)((ulong)uVar1 >> 0x20);
  uStack_2c = (float)((ulong)uVar2 >> 0x20);
  fVar3 = local_28 * local_30 + uStack_24 * uStack_2c;
  if (0.0 <= fVar3) {
    if (fVar3 <= local_30 * local_30 + uStack_2c * uStack_2c) {
      auVar6._0_8_ = operator*(in_stack_ffffffffffffffa8,0.0);
      auVar6._8_56_ = extraout_var_01;
      vmovlpd_avx(auVar6._0_16_);
      auVar7._0_8_ = operator/(in_stack_ffffffffffffffa8,0.0);
      auVar7._8_56_ = extraout_var_02;
      vmovlpd_avx(auVar7._0_16_);
      auVar8._0_8_ = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1ad009);
      auVar8._8_56_ = extraout_var_03;
      local_8 = (ImVec2)vmovlpd_avx(auVar8._0_16_);
    }
    else {
      local_8 = *in_RSI;
    }
  }
  else {
    local_8 = *in_RDI;
  }
  return local_8;
}

Assistant:

ImVec2 ImLineClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& p)
{
    ImVec2 ap = p - a;
    ImVec2 ab_dir = b - a;
    float dot = ap.x * ab_dir.x + ap.y * ab_dir.y;
    if (dot < 0.0f)
        return a;
    float ab_len_sqr = ab_dir.x * ab_dir.x + ab_dir.y * ab_dir.y;
    if (dot > ab_len_sqr)
        return b;
    return a + ab_dir * dot / ab_len_sqr;
}